

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O3

void * parseContent(SymbolContext<char> *ctx)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  string *psVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = 0;
  lVar1 = ctx->symbol->start;
  lVar5 = (long)ctx->context->m_window + lVar1;
  iVar7 = (int)ctx->symbol->end - (int)lVar1;
  if (iVar7 < 1) {
LAB_0010ee58:
    if (iVar6 != iVar7) {
      psVar4 = (string *)operator_new(0x20);
      *(string **)psVar4 = psVar4 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar4,lVar5,iVar7 + lVar5);
      return psVar4;
    }
  }
  else {
    do {
      iVar2 = isspace(iVar6);
      if (iVar2 == 0) goto LAB_0010ee58;
      iVar6 = iVar6 + 1;
    } while (iVar7 != iVar6);
  }
  plVar3 = (long *)operator_new(0x20);
  *plVar3 = (long)(plVar3 + 2);
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  return plVar3;
}

Assistant:

const std::string& get_content() const
    {
        return m_content;
    }